

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<optTyped_swapEmptyWithNotEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>_>
::CreateTest(TestFactoryImpl<optTyped_swapEmptyWithNotEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>_>
             *this)

{
  optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
  *this_00;
  
  this_00 = (optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
             *)operator_new(0x18);
  anon_unknown.dwarf_df08::
  optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
  ::optTyped(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001ca988;
  return &this_00->super_Test;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }